

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# union_underlying_type_test_generated.h
# Opt level: O2

void * UnionUnderlyingType::ABCUnion::UnPack(void *obj,ABC type,resolver_function_t *resolver)

{
  AT *pAVar1;
  BT *pBVar2;
  CT *pCVar3;
  
  if (type == C) {
    pCVar3 = C::UnPack((C *)obj,resolver);
    return pCVar3;
  }
  if (type != B) {
    if (type == A) {
      pAVar1 = A::UnPack((A *)obj,resolver);
      return pAVar1;
    }
    return (void *)0x0;
  }
  pBVar2 = B::UnPack((B *)obj,resolver);
  return pBVar2;
}

Assistant:

inline void *ABCUnion::UnPack(const void *obj, ABC type, const ::flatbuffers::resolver_function_t *resolver) {
  (void)resolver;
  switch (type) {
    case ABC::A: {
      auto ptr = reinterpret_cast<const UnionUnderlyingType::A *>(obj);
      return ptr->UnPack(resolver);
    }
    case ABC::B: {
      auto ptr = reinterpret_cast<const UnionUnderlyingType::B *>(obj);
      return ptr->UnPack(resolver);
    }
    case ABC::C: {
      auto ptr = reinterpret_cast<const UnionUnderlyingType::C *>(obj);
      return ptr->UnPack(resolver);
    }
    default: return nullptr;
  }
}